

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  TestResult *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  TestPartResult *pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  string *value;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  char *pcVar11;
  internal *this_00;
  int iVar12;
  string location;
  string message;
  string kIndent;
  string kTestsuite;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_100;
  string local_e0;
  string local_c0;
  ostream *local_a0;
  string local_98;
  string local_78;
  TestResult *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_58 = (TestResult *)test_suite_name;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"testcase","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0.field_2._M_allocated_capacity = 0x2020202020202020;
  local_c0.field_2._8_2_ = 0x2020;
  local_c0._M_string_length = 10;
  local_c0.field_2._M_local_buf[10] = '\0';
  paVar9 = &local_100.field_2;
  local_100.field_2._M_allocated_capacity = 0x2020202020202020;
  local_100._M_string_length = 8;
  local_100.field_2._M_local_buf[8] = '\0';
  local_100._M_dataplus._M_p = (pointer)paVar9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar9->_M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar9) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(test_info->name_)._M_dataplus._M_p,(allocator<char> *)&local_78);
  OutputJsonKey(stream,&local_98,&local_100,&local_e0,&local_c0,true);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar9) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pbVar7 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar7->_M_dataplus)._M_p != (pointer)0x0)) {
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"value_param","");
    pbVar7 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var10._M_p = (char *)0x0;
    }
    else {
      _Var10._M_p = (pbVar7->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,_Var10._M_p,(allocator<char> *)&local_78);
    OutputJsonKey(stream,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar7 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar7->_M_dataplus)._M_p != (pointer)0x0)) {
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"type_param","");
    pbVar7 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var10._M_p = (char *)0x0;
    }
    else {
      _Var10._M_p = (pbVar7->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,_Var10._M_p,(allocator<char> *)&local_78);
    OutputJsonKey(stream,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"file","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,(test_info->location_).file._M_dataplus._M_p,
               (allocator<char> *)&local_78);
    OutputJsonKey(stream,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"line","");
    OutputJsonKey(stream,&local_98,&local_100,(test_info->location_).line,&local_c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_100.field_2._M_allocated_capacity = 0x2020202020202020;
    local_100._M_string_length = 8;
    local_100.field_2._M_local_buf[8] = '\0';
    local_100._M_dataplus._M_p = (pointer)paVar9;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar9->_M_local_buf,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar9) goto LAB_00144e27;
  }
  else {
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"status","");
    pcVar11 = "NOTRUN";
    if ((ulong)test_info->should_run_ != 0) {
      pcVar11 = "RUN";
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,pcVar11,pcVar11 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
    OutputJsonKey(stream,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"result","");
    this = &test_info->result_;
    local_a0 = stream;
    if (test_info->should_run_ == true) {
      bVar2 = TestResult::Skipped(this);
      pcVar11 = "COMPLETED";
      if (bVar2) {
        pcVar11 = "SKIPPED";
      }
    }
    else {
      pcVar11 = "SUPPRESSED";
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(pcVar11);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar11,pcVar11 + sVar5);
    poVar4 = local_a0;
    OutputJsonKey(local_a0,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_e0,(internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(poVar4,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&local_e0,(internal *)(test_info->result_).elapsed_time_,ms_00);
    OutputJsonKey(poVar4,&local_98,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"classname","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,(char *)local_58,(allocator<char> *)&local_78);
    value = &local_e0;
    OutputJsonKey(poVar4,&local_98,&local_100,value,&local_c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    TestPropertiesAsJson(&local_100,this,&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,local_100._M_dataplus._M_p,local_100._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar9) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(test_info->result_).test_part_results_.
                               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
      i = 0;
      iVar12 = 0;
      local_58 = this;
      do {
        pTVar6 = TestResult::GetTestPartResult(local_58,i);
        iVar3 = (int)value;
        if (pTVar6->type_ - kNonFatalFailure < 2) {
          std::__ostream_insert<char,std::char_traits<char>>(local_a0,",\n",2);
          if (iVar12 == 0) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_a0,local_c0._M_dataplus._M_p,local_c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"failures",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
          }
          this_00 = (internal *)(pTVar6->file_name_)._M_string_length;
          if (this_00 != (internal *)0x0) {
            this_00 = (internal *)(pTVar6->file_name_)._M_dataplus._M_p;
          }
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    (&local_100,this_00,(char *)(ulong)(uint)pTVar6->line_number_,iVar3);
          poVar4 = local_a0;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_100._M_dataplus._M_p,
                     local_100._M_dataplus._M_p + local_100._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_50,"\n");
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50,(pTVar6->message_)._M_dataplus._M_p);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar7->_M_dataplus)._M_p;
          value = (string *)&pbVar7->field_2;
          if ((string *)paVar9 == value) {
            local_78.field_2._M_allocated_capacity = *(undefined8 *)value;
            local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          }
          else {
            local_78.field_2._M_allocated_capacity = *(undefined8 *)value;
            local_78._M_dataplus._M_p = (pointer)paVar9;
          }
          local_78._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)value;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          EscapeJson(&local_e0,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"failure\": \"",0x10);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"type\": \"\"\n",0xf);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          iVar12 = iVar12 + 1;
        }
        poVar4 = local_a0;
        i = i + 1;
        iVar3 = (int)((ulong)((long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_info->result_).test_part_results_.
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      } while (SBORROW4(i,iVar3 * -0x49249249) != i + iVar3 * 0x49249249 < 0);
      if (0 < iVar12) {
        std::__ostream_insert<char,std::char_traits<char>>(local_a0,"\n",1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      }
    }
    paVar9 = &local_100.field_2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    local_100.field_2._M_allocated_capacity = 0x2020202020202020;
    local_100._M_string_length = 8;
    local_100.field_2._M_local_buf[8] = '\0';
    local_100._M_dataplus._M_p = (pointer)paVar9;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,paVar9->_M_local_buf,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar9) goto LAB_00144e27;
  }
  operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
LAB_00144e27:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}